

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v5::internal::
       parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
                 *handler)

{
  uint_least8_t *puVar1;
  char cVar2;
  byte bVar3;
  type tVar4;
  basic_format_specs<char> *pbVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *this;
  alignment aVar12;
  char *pcVar13;
  char *local_40;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  local_38;
  
  if (begin == end) {
    return begin;
  }
  cVar2 = *begin;
  if (cVar2 == L'}') {
    return begin;
  }
  pcVar13 = begin + 1;
  uVar9 = (ulong)(pcVar13 != end);
  do {
    bVar3 = begin[uVar9];
    bVar7 = false;
    bVar6 = true;
    if (bVar3 < 0x3e) {
      if (bVar3 == 0x3c) {
        aVar12 = ALIGN_LEFT;
        goto LAB_0011f876;
      }
      aVar12 = ALIGN_DEFAULT;
      if (bVar3 == 0x3d) {
        aVar12 = ALIGN_NUMERIC;
        bVar7 = true;
        bVar6 = false;
      }
    }
    else {
      if (bVar3 == 0x3e) {
        aVar12 = ALIGN_RIGHT;
      }
      else {
        aVar12 = ALIGN_DEFAULT;
        if (bVar3 != 0x5e) goto LAB_0011f87a;
        aVar12 = ALIGN_CENTER;
      }
LAB_0011f876:
      bVar6 = false;
      bVar7 = false;
    }
LAB_0011f87a:
    if (!bVar6) {
      local_40 = begin;
      if (0 < (long)uVar9) {
        if (cVar2 == '{') {
          error_handler::on_error
                    ((error_handler *)
                     (handler->
                     super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                     ).context_,"invalid fill character \'{\'");
        }
        pcVar13 = begin + 2;
        (((handler->
          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ).super_specs_setter<char>.specs_)->super_align_spec).fill_ = (int)cVar2;
        if (cVar2 == '{') break;
      }
      if ((bVar7) && (8 < handler->arg_type_ - named_arg_type)) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"format specifier requires numeric argument");
      }
      (((handler->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ).super_specs_setter<char>.specs_)->super_align_spec).align_ = aVar12;
      begin = pcVar13;
      break;
    }
    bVar6 = 0 < (long)uVar9;
    uVar9 = uVar9 - 1;
  } while (bVar6);
  if (begin == end) {
    return begin;
  }
  cVar2 = *begin;
  local_40 = begin;
  if (cVar2 == ' ') {
    if (8 < handler->arg_type_ - named_arg_type) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"format specifier requires numeric argument");
    }
    tVar4 = handler->arg_type_;
    if ((tVar4 - named_arg_type < 7) &&
       ((char_type < tVar4 || ((0x94U >> (tVar4 & 0x1f) & 1) == 0)))) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"format specifier requires signed argument");
    }
    puVar1 = &(((handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                ).super_specs_setter<char>.specs_)->super_core_format_specs).flags;
    *puVar1 = *puVar1 | 1;
LAB_0011fa2c:
    local_40 = begin + 1;
  }
  else {
    if (cVar2 == '-') {
      if (8 < handler->arg_type_ - named_arg_type) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"format specifier requires numeric argument");
      }
      tVar4 = handler->arg_type_;
      if ((tVar4 - named_arg_type < 7) &&
         ((char_type < tVar4 || ((0x94U >> (tVar4 & 0x1f) & 1) == 0)))) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"format specifier requires signed argument");
      }
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  ).super_specs_setter<char>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 4;
      goto LAB_0011fa2c;
    }
    if (cVar2 == '+') {
      if (8 < handler->arg_type_ - named_arg_type) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"format specifier requires numeric argument");
      }
      tVar4 = handler->arg_type_;
      if ((tVar4 - named_arg_type < 7) &&
         ((char_type < tVar4 || ((0x94U >> (tVar4 & 0x1f) & 1) == 0)))) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"format specifier requires signed argument");
      }
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  ).super_specs_setter<char>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 3;
      goto LAB_0011fa2c;
    }
  }
  pcVar13 = local_40;
  if (local_40 != end) {
    if (*local_40 == '#') {
      if (8 < handler->arg_type_ - named_arg_type) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"format specifier requires numeric argument");
      }
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  ).super_specs_setter<char>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 8;
      local_40 = local_40 + 1;
      if (local_40 == end) {
        return local_40;
      }
    }
    if (*local_40 == '0') {
      if (8 < handler->arg_type_ - named_arg_type) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"format specifier requires numeric argument");
      }
      pbVar5 = (handler->
               super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               ).super_specs_setter<char>.specs_;
      (pbVar5->super_align_spec).fill_ = L'0';
      (pbVar5->super_align_spec).align_ = ALIGN_NUMERIC;
      local_40 = local_40 + 1;
      if (local_40 == end) {
        return local_40;
      }
    }
    cVar2 = *local_40;
    if ((byte)(cVar2 - 0x30U) < 10) {
      uVar10 = 0;
      pcVar11 = local_40 + 1;
      pcVar13 = local_40 + 1;
      if (cVar2 != '0') {
        while (uVar10 < 0xccccccd) {
          uVar10 = ((int)pcVar11[-1] + uVar10 * 10) - 0x30;
          pcVar13 = end;
          if ((pcVar11 == end) ||
             (cVar2 = *pcVar11, pcVar13 = pcVar11, pcVar11 = pcVar11 + 1, 9 < (byte)(cVar2 - 0x30U))
             ) goto LAB_0011fb7a;
        }
        uVar10 = 0x80000000;
        pcVar13 = pcVar11 + -1;
LAB_0011fb7a:
        if ((int)uVar10 < 0) {
          error_handler::on_error
                    ((error_handler *)
                     (handler->
                     super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                     ).context_,"number is too big");
        }
      }
      local_40 = pcVar13;
      (((handler->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ).super_specs_setter<char>.specs_)->super_align_spec).width_ = uVar10;
    }
    else if (cVar2 == '{') {
      pcVar13 = local_40 + 1;
      if (pcVar13 != end) {
        local_38.handler = handler;
        pcVar13 = parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                            (pcVar13,end,&local_38);
      }
      if ((pcVar13 == end) || (*pcVar13 != '}')) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"invalid format string");
      }
      local_40 = pcVar13 + 1;
    }
    pcVar13 = local_40;
    if (local_40 != end) {
      if (*local_40 == '.') {
        pcVar13 = local_40 + 1;
        if (pcVar13 == end) {
          iVar8 = 0;
        }
        else {
          iVar8 = (int)*pcVar13;
        }
        if (iVar8 - 0x30U < 10) {
          local_40 = pcVar13;
          uVar10 = parse_nonnegative_int<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                             (&local_40,end,handler);
          (((handler->
            super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            ).super_specs_setter<char>.specs_)->super_core_format_specs).precision = uVar10;
        }
        else {
          if (iVar8 != 0x7b) {
            this = (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_;
            pcVar11 = "missing precision specifier";
            local_40 = pcVar13;
LAB_0011fc75:
            error_handler::on_error((error_handler *)this,pcVar11);
          }
          local_40 = local_40 + 2;
          if (local_40 != end) {
            local_38.handler = handler;
            local_40 = parse_arg_id<char,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                                 (local_40,end,
                                  (precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
                                   *)&local_38);
          }
          if ((local_40 == end) ||
             (pcVar13 = local_40 + 1, cVar2 = *local_40, local_40 = pcVar13, cVar2 != '}')) {
            this = (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_;
            pcVar11 = "invalid format string";
            goto LAB_0011fc75;
          }
        }
        if ((handler->arg_type_ - named_arg_type < 7) || (handler->arg_type_ == pointer_type)) {
          error_handler::on_error
                    ((error_handler *)
                     (handler->
                     super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                     ).context_,"precision not allowed for this argument type");
        }
      }
      pcVar13 = local_40;
      if ((local_40 != end) && (*local_40 != '}')) {
        pcVar13 = local_40 + 1;
        (((handler->
          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ).super_specs_setter<char>.specs_)->super_core_format_specs).type = *local_40;
      }
    }
  }
  return pcVar13;
}

Assistant:

FMT_CONSTEXPR const Char *parse_format_specs(
    const Char *begin, const Char *end, SpecHandler &&handler) {
  if (begin == end || *begin == '}')
    return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    ++begin;
    auto c = begin != end ? *begin : 0;
    if ('0' <= c && c <= '9') {
      handler.on_precision(parse_nonnegative_int(begin, end, handler));
    } else if (c == '{') {
      ++begin;
      if (begin != end) {
        begin = parse_arg_id(
              begin, end, precision_adapter<SpecHandler, Char>(handler));
      }
      if (begin == end || *begin++ != '}')
        return handler.on_error("invalid format string"), begin;
    } else {
      return handler.on_error("missing precision specifier"), begin;
    }
    handler.end_precision();
  }

  // Parse type.
  if (begin != end && *begin != '}')
    handler.on_type(*begin++);
  return begin;
}